

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h.h
# Opt level: O2

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZQuadraticTetra>::TPZGeoElRefPattern
          (TPZGeoElRefPattern<pzgeom::TPZQuadraticTetra> *this,TPZVec<long> *nodeindices,int matind,
          TPZGeoMesh *mesh,int64_t *index)

{
  *(undefined ***)&(this->super_TPZGeoElRefLess<pzgeom::TPZQuadraticTetra>).super_TPZGeoEl =
       &PTR__TPZSavable_016e4dd0;
  TPZGeoElRefLess<pzgeom::TPZQuadraticTetra>::TPZGeoElRefLess
            (&this->super_TPZGeoElRefLess<pzgeom::TPZQuadraticTetra>,&PTR_PTR_016e46a8,nodeindices,
             matind,mesh,index);
  *(undefined ***)&(this->super_TPZGeoElRefLess<pzgeom::TPZQuadraticTetra>).super_TPZGeoEl =
       &PTR__TPZGeoElRefPattern_016e43a8;
  (this->fSubEl)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649268;
  (this->fSubEl).fStore = (long *)0x0;
  (this->fSubEl).fNElements = 0;
  (this->fSubEl).fNAlloc = 0;
  TPZAutoPointer<TPZRefPattern>::TPZAutoPointer(&this->fRefPattern);
  return;
}

Assistant:

TPZGeoElRefPattern<TGeo>::TPZGeoElRefPattern(TPZVec<int64_t> &nodeindices,int matind,TPZGeoMesh &mesh, int64_t &index) :
TPZRegisterClassId(&TPZGeoElRefPattern<TGeo>::ClassId),TPZGeoElRefLess<TGeo>(nodeindices,matind,mesh,index)
{
}